

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  Vector<kj::CidrRange> *this_00;
  RemoveConst<kj::CidrRange> **ppRVar1;
  CidrRange *pCVar2;
  CidrRange *pCVar3;
  RemoveConst<kj::CidrRange> *pRVar4;
  size_t sVar5;
  uint in_R8D;
  undefined1 local_34 [12];
  byte abStack_28 [8];
  undefined8 local_20;
  
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00709b70;
  this_00 = &this->allowCidrs;
  (this->allowCidrs).builder.ptr = (CidrRange *)0x0;
  (this->allowCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->allowCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->allowCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  (this->denyCidrs).builder.ptr = (CidrRange *)0x0;
  (this->denyCidrs).builder.pos = (RemoveConst<kj::CidrRange> *)0x0;
  (this->denyCidrs).builder.endPtr = (CidrRange *)0x0;
  (this->denyCidrs).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  this->allowPublic = false;
  this->allowNetwork = false;
  (this->next).ptr = (NetworkFilter *)0x0;
  local_34._0_4_ = 0;
  CidrRange::inet4((CidrRange *)(local_34 + 4),(CidrRange *)local_34,
                   (ArrayPtr<const_unsigned_char>)ZEXT816(4),in_R8D);
  pCVar2 = (this->allowCidrs).builder.endPtr;
  if ((this->allowCidrs).builder.pos == pCVar2) {
    pCVar3 = (this_00->builder).ptr;
    sVar5 = 4;
    if (pCVar2 != pCVar3) {
      sVar5 = ((long)pCVar2 - (long)pCVar3 >> 3) * 0x5555555555555556;
    }
    Vector<kj::CidrRange>::setCapacity(this_00,sVar5);
  }
  pRVar4 = (this->allowCidrs).builder.pos;
  *(undefined8 *)(pRVar4->bits + 0xc) = local_20;
  pRVar4->family = local_34._4_4_;
  pRVar4->bits[0] = local_34[8];
  pRVar4->bits[1] = local_34[9];
  pRVar4->bits[2] = local_34[10];
  pRVar4->bits[3] = local_34[0xb];
  *(byte (*) [8])(pRVar4->bits + 4) = abStack_28;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  CidrRange::inet6((CidrRange *)(local_34 + 4),(ArrayPtr<const_unsigned_short>)ZEXT816(0),
                   (ArrayPtr<const_unsigned_short>)ZEXT816(0),0);
  pCVar2 = (this->allowCidrs).builder.endPtr;
  if ((this->allowCidrs).builder.pos == pCVar2) {
    pCVar3 = (this_00->builder).ptr;
    sVar5 = 4;
    if (pCVar2 != pCVar3) {
      sVar5 = ((long)pCVar2 - (long)pCVar3 >> 3) * 0x5555555555555556;
    }
    Vector<kj::CidrRange>::setCapacity(this_00,sVar5);
  }
  pRVar4 = (this->allowCidrs).builder.pos;
  *(undefined8 *)(pRVar4->bits + 0xc) = local_20;
  pRVar4->family = local_34._4_4_;
  pRVar4->bits[0] = local_34[8];
  pRVar4->bits[1] = local_34[9];
  pRVar4->bits[2] = local_34[10];
  pRVar4->bits[3] = local_34[0xb];
  *(byte (*) [8])(pRVar4->bits + 4) = abStack_28;
  ppRVar1 = &(this->allowCidrs).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
}